

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsPublicationSetMinimumChange(HelicsPublication pub,double tolerance,HelicsError *err)

{
  PublicationObject *pPVar1;
  HelicsPublication in_RSI;
  double in_XMM0_Qa;
  PublicationObject *pubObj;
  HelicsError *in_stack_ffffffffffffffe0;
  
  pPVar1 = anon_unknown.dwarf_5d1c2::verifyPublication(in_RSI,in_stack_ffffffffffffffe0);
  if (pPVar1 != (PublicationObject *)0x0) {
    helics::Publication::setMinimumChange(pPVar1->pubPtr,in_XMM0_Qa);
  }
  return;
}

Assistant:

void helicsPublicationSetMinimumChange(HelicsPublication pub, double tolerance, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    pubObj->pubPtr->setMinimumChange(tolerance);
}